

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::avx512::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  RTCFormat RVar1;
  InstanceArray *this;
  RTCRayQueryContext *pRVar2;
  RawBufferView *pRVar3;
  char *pcVar4;
  RawBufferView *pRVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined8 uVar7;
  byte bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  Accel *pAVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar51;
  vfloat4 a0_2;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar52;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vfloat4 a0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_ZMM1 [64];
  vfloat4 a0_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_ZMM2 [64];
  undefined4 uVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 in_ZMM3 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 in_ZMM5 [64];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 in_ZMM6 [64];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 in_ZMM7 [64];
  vfloat4 a1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  RayQueryContext newcontext;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 auStack_148 [16];
  undefined1 local_138 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  auVar30 = in_ZMM6._0_16_;
  auVar33 = in_ZMM4._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  auVar34 = in_ZMM7._0_16_;
  auVar28 = in_ZMM3._0_16_;
  a0_1.field_0 = in_ZMM2._0_16_;
  uVar24 = (ulong)prim->instID_;
  this = (InstanceArray *)(context->scene->geometries).items[uVar24].ptr;
  pAVar18 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (((pAVar18 == (Accel *)0x0) || ((ray->mask & (this->super_Geometry).mask) == 0)) ||
     (pRVar2 = context->user, pRVar2->instID[0] != 0xffffffff)) {
    bVar17 = false;
  }
  else {
    auVar27._8_8_ = 0;
    auVar27._0_4_ = prim->primID_;
    auVar27._4_4_ = prim->instID_;
    auVar27 = vprolq_avx512vl(auVar27,0x20);
    *pRVar2 = auVar27._0_8_;
    uVar19 = (ulong)prim->primID_;
    if ((this->super_Geometry).numTimeSteps == 1) {
      pRVar3 = (this->l2w_buf).items;
      RVar1 = pRVar3->format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x10)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x20)),0x28);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x14)),0x1c);
          auVar33 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),0x28);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x28)),0x28);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x1c)),0x1c);
          auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x2c)),0x28);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)(pcVar4 + lVar20 + 4);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20)),_DAT_01fbb140,auVar58)
          ;
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),_DAT_01fbb140,
                                       auVar74);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),_DAT_01fbb140
                                            ,auVar59);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x28);
          auVar28 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),_DAT_01fbb140,
                                       auVar60);
        }
        else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          auVar30 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),0x20);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x34);
          auVar34 = vpermt2ps_avx512vl(auVar66,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar20)));
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          fVar52 = *(float *)(pcVar4 + lVar20 + 0x24);
          fVar91 = *(float *)(pcVar4 + lVar20 + 0x28);
          fVar26 = *(float *)(pcVar4 + lVar20 + 0x2c);
          auVar33 = vpermt2ps_avx512vl(auVar106,_DAT_01fbb150,
                                       ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)));
          fVar82 = *(float *)(pcVar4 + lVar20 + 0x30);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * fVar91)),ZEXT416((uint)fVar52),
                                    ZEXT416((uint)fVar52));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar27 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar28._0_4_));
          fVar111 = auVar27._0_4_;
          fVar111 = fVar111 * 1.5 + fVar111 * fVar111 * fVar111 * auVar28._0_4_ * -0.5;
          auVar28 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar111 * fVar52)),0x30);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar34,ZEXT416((uint)(fVar111 * fVar91)),0x30);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar30,ZEXT416((uint)(fVar111 * fVar82)),0x30);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),0x10);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x3c)),0x20);
          auVar33 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar26 * fVar111)),0x30);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar20))->v;
          auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x10);
          a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                          ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar20 + 0x20)
                          )->v;
          auVar28 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x30);
        }
        auVar34 = vshufps_avx(auVar28,auVar28,0xff);
        auVar27 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
        auVar32 = vshufps_avx(auVar33,auVar33,0xff);
        auVar37 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
        auVar30 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])0x0,0xe9);
        auVar30 = vblendps_avx(auVar30,auVar33,4);
        fVar116 = auVar27._0_4_;
        auVar29 = vfmadd213ss_fma(auVar34,auVar34,ZEXT416((uint)(fVar116 * fVar116)));
        auVar29 = vfnmadd231ss_fma(auVar29,auVar32,auVar32);
        auVar31 = vfnmadd231ss_fma(auVar29,auVar37,auVar37);
        fVar111 = auVar34._0_4_;
        auVar35 = ZEXT416((uint)(auVar37._0_4_ * fVar111));
        auVar29 = vfmadd213ss_fma(auVar32,auVar27,auVar35);
        fVar52 = auVar29._0_4_ + auVar29._0_4_;
        auVar62 = ZEXT416((uint)(auVar32._0_4_ * fVar111));
        auVar29 = vfmsub213ss_fma(auVar37,auVar27,auVar62);
        fVar91 = auVar29._0_4_ + auVar29._0_4_;
        auVar29 = vfmsub231ss_fma(auVar35,auVar27,auVar32);
        fVar26 = auVar29._0_4_ + auVar29._0_4_;
        auVar29 = vfmsub231ss_fma(ZEXT416((uint)(fVar116 * fVar116)),auVar34,auVar34);
        auVar34 = vfmadd213ss_avx512f(auVar32,auVar32,auVar29);
        auVar35 = vfnmadd231ss_avx512f(auVar34,auVar37,auVar37);
        auVar34 = vfmadd213ss_avx512f(auVar37,auVar32,ZEXT416((uint)(fVar116 * fVar111)));
        auVar36 = vaddss_avx512f(auVar34,auVar34);
        auVar34 = vfmadd213ss_fma(auVar27,auVar37,auVar62);
        fVar82 = auVar34._0_4_ + auVar34._0_4_;
        auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar116 * fVar111)),auVar32,auVar37);
        fVar111 = auVar34._0_4_ + auVar34._0_4_;
        auVar34 = vfnmadd231ss_fma(auVar29,auVar32,auVar32);
        auVar27 = vfmadd231ss_fma(auVar34,auVar37,auVar37);
        uVar81 = auVar31._0_4_;
        auVar124._4_4_ = uVar81;
        auVar124._0_4_ = uVar81;
        auVar124._8_4_ = uVar81;
        auVar124._12_4_ = uVar81;
        auVar130._4_4_ = fVar52;
        auVar130._0_4_ = fVar52;
        auVar130._8_4_ = fVar52;
        auVar130._12_4_ = fVar52;
        auVar134._0_4_ = fVar91 * 0.0;
        auVar134._4_4_ = fVar91 * 0.0;
        auVar134._8_4_ = fVar91 * 1.0;
        auVar134._12_4_ = fVar91 * 0.0;
        auVar29 = ZEXT816(0x3f80000000000000);
        auVar34 = vfmadd231ps_fma(auVar134,auVar29,auVar130);
        auVar31 = SUB6416(ZEXT464(0x3f800000),0);
        auVar32 = vfmadd231ps_fma(auVar34,auVar31,auVar124);
        auVar125._4_4_ = fVar26;
        auVar125._0_4_ = fVar26;
        auVar125._8_4_ = fVar26;
        auVar125._12_4_ = fVar26;
        auVar34 = vbroadcastss_avx512vl(auVar35);
        auVar37 = vbroadcastss_avx512vl(auVar36);
        auVar133._0_4_ = auVar37._0_4_ * 0.0;
        auVar133._4_4_ = auVar37._4_4_ * 0.0;
        auVar133._8_4_ = auVar37._8_4_ * 1.0;
        auVar133._12_4_ = auVar37._12_4_ * 0.0;
        auVar34 = vfmadd231ps_fma(auVar133,auVar29,auVar34);
        auVar37 = vfmadd231ps_fma(auVar34,auVar31,auVar125);
        auVar118._4_4_ = fVar82;
        auVar118._0_4_ = fVar82;
        auVar118._8_4_ = fVar82;
        auVar118._12_4_ = fVar82;
        auVar113._4_4_ = fVar111;
        auVar113._0_4_ = fVar111;
        auVar113._8_4_ = fVar111;
        auVar113._12_4_ = fVar111;
        fVar52 = auVar27._0_4_;
        auVar126._0_4_ = fVar52 * 0.0;
        auVar126._4_4_ = fVar52 * 0.0;
        auVar126._8_4_ = fVar52 * 1.0;
        auVar126._12_4_ = fVar52 * 0.0;
        auVar34 = vfmadd231ps_fma(auVar126,auVar29,auVar113);
        auVar34 = vfmadd231ps_fma(auVar34,auVar31,auVar118);
        auVar67._0_4_ = a0.field_0._0_4_;
        auVar67._4_4_ = auVar67._0_4_;
        auVar67._8_4_ = auVar67._0_4_;
        auVar67._12_4_ = auVar67._0_4_;
        fVar52 = auVar34._0_4_;
        auVar114._0_4_ = fVar52 * 0.0;
        fVar91 = auVar34._4_4_;
        auVar114._4_4_ = fVar91 * 0.0;
        fVar26 = auVar34._8_4_;
        auVar114._8_4_ = fVar26 * 0.0;
        fVar82 = auVar34._12_4_;
        auVar114._12_4_ = fVar82 * 0.0;
        auVar34 = vfmadd213ps_fma((undefined1  [16])0x0,auVar37,auVar114);
        auVar27 = vfmadd231ps_fma(auVar34,auVar32,auVar67);
        uVar81 = auVar33._0_4_;
        auVar119._4_4_ = uVar81;
        auVar119._0_4_ = uVar81;
        auVar119._8_4_ = uVar81;
        auVar119._12_4_ = uVar81;
        auVar34 = vshufps_avx(auVar33,auVar33,0x55);
        auVar34 = vfmadd213ps_fma(auVar34,auVar37,auVar114);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar34,auVar32,auVar119);
        iVar21 = a0_1.field_0._0_4_;
        auVar99._4_4_ = iVar21;
        auVar99._0_4_ = iVar21;
        auVar99._8_4_ = iVar21;
        auVar99._12_4_ = iVar21;
        auVar34 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
        auVar33 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
        auVar75._0_4_ = fVar52 * auVar33._0_4_;
        auVar75._4_4_ = fVar91 * auVar33._4_4_;
        auVar75._8_4_ = fVar26 * auVar33._8_4_;
        auVar75._12_4_ = fVar82 * auVar33._12_4_;
        auVar34 = vfmadd231ps_fma(auVar75,auVar37,auVar34);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar34,auVar32,auVar99);
        uVar81 = auVar28._0_4_;
        auVar100._4_4_ = uVar81;
        auVar100._0_4_ = uVar81;
        auVar100._8_4_ = uVar81;
        auVar100._12_4_ = uVar81;
        auVar34 = vshufps_avx(auVar28,auVar28,0x55);
        auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
        auVar88._0_4_ = fVar52 * auVar28._0_4_;
        auVar88._4_4_ = fVar91 * auVar28._4_4_;
        auVar88._8_4_ = fVar26 * auVar28._8_4_;
        auVar88._12_4_ = fVar82 * auVar28._12_4_;
        auVar28 = vfmadd231ps_fma(auVar88,auVar37,auVar34);
        auVar34 = vfmadd231ps_fma(auVar28,auVar32,auVar100);
        auVar28._0_4_ = auVar30._0_4_ + 0.0 + auVar34._0_4_;
        auVar28._4_4_ = auVar30._4_4_ + 0.0 + auVar34._4_4_;
        auVar28._8_4_ = auVar30._8_4_ + 0.0 + auVar34._8_4_;
        auVar28._12_4_ = auVar30._12_4_ + 0.0 + auVar34._12_4_;
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar20 = uVar19 * pRVar3->stride;
        auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20)),
                                ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x10)),0x1c);
        auVar27 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x20)),0x28);
        auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),
                                ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x14)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),0x28);
        auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),
                                ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x28)),0x28);
        auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x1c)),0x1c);
        auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar20 = uVar19 * pRVar3->stride;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)(pcVar4 + lVar20 + 4);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
        auVar27 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20)),_DAT_01fbb140,auVar72);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),_DAT_01fbb140,
                                        auVar83);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),_DAT_01fbb140,
                                          auVar84);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x28);
        auVar28 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),_DAT_01fbb140,
                                     auVar101);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar20 = uVar19 * pRVar3->stride;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
        auVar30 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),0x20);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x34);
        auVar34 = vpermt2ps_avx512vl(auVar54,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar20)));
        auVar102._8_8_ = 0;
        auVar102._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
        fVar52 = *(float *)(pcVar4 + lVar20 + 0x24);
        fVar91 = *(float *)(pcVar4 + lVar20 + 0x28);
        fVar26 = *(float *)(pcVar4 + lVar20 + 0x2c);
        auVar33 = vpermt2ps_avx512vl(auVar102,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)));
        fVar82 = *(float *)(pcVar4 + lVar20 + 0x30);
        auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * fVar91)),ZEXT416((uint)fVar52),
                                  ZEXT416((uint)fVar52));
        auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
        auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
        auVar27 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar28._0_4_));
        fVar111 = auVar27._0_4_;
        fVar111 = fVar111 * 1.5 + fVar111 * fVar111 * fVar111 * auVar28._0_4_ * -0.5;
        auVar28 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar111 * fVar52)),0x30);
        auVar27 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar111 * fVar91)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416((uint)(fVar111 * fVar82)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),0x10);
        auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x3c)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416((uint)(fVar26 * fVar111)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar20 = uVar19 * pRVar3->stride;
        auVar27 = *(undefined1 (*) [16])(pcVar4 + lVar20);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar20 + 0x10))->v
        ;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar20 + 0x20))
                        ->v;
        auVar28 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x30);
      }
    }
    else {
      fVar52 = (this->super_Geometry).fnumTimeSegments;
      fVar91 = (this->super_Geometry).time_range.lower;
      fVar26 = (this->super_Geometry).time_range.upper;
      auVar29 = ZEXT416((uint)fVar26);
      fVar91 = fVar52 * (((ray->dir).field_0.m128[3] - fVar91) / (fVar26 - fVar91));
      auVar28 = ZEXT416((uint)fVar91);
      auVar27 = vroundss_avx(ZEXT416((uint)fVar91),ZEXT416((uint)fVar91),9);
      auVar32 = vminss_avx(auVar27,ZEXT416((uint)(fVar52 + -1.0)));
      auVar37 = ZEXT816(0) << 0x20;
      auVar27 = SUB6416(ZEXT864(0),0) << 0x20;
      auVar32 = vmaxss_avx(auVar37,auVar32);
      fVar91 = fVar91 - auVar32._0_4_;
      iVar21 = (int)auVar32._0_4_;
      lVar20 = CONCAT44((int)(uVar24 >> 0x20),iVar21);
      pRVar5 = (this->l2w_buf).items;
      pRVar3 = pRVar5 + lVar20;
      RVar1 = pRVar5[lVar20].format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        auVar28 = ZEXT416((uint)fVar91);
        if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          auVar27 = ZEXT416(*(uint *)(pcVar4 + lVar20 + 8));
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x10)),0x1c);
          local_168 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x20)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x14)),0x1c);
          auStack_148 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),0x1c);
          local_138 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x28)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x1c)),0x1c);
          local_178 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x2c)),0x28);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(pcVar4 + lVar20 + 4);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          local_168 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20)),_DAT_01fbb140,auVar34);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),_DAT_01fbb140,
                                       auVar33);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          local_138 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),_DAT_01fbb140,
                                         auVar32);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x28);
          auVar27 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),_DAT_01fbb140,
                                       auVar37);
          local_178 = auVar27;
          auStack_148 = auVar33;
        }
        else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          auVar34 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),0x20);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x34);
          auVar33 = ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc));
          auVar27 = vpermt2ps_avx512vl(auVar29,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar20)));
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          fVar52 = *(float *)(pcVar4 + lVar20 + 0x24);
          fVar26 = *(float *)(pcVar4 + lVar20 + 0x28);
          fVar82 = *(float *)(pcVar4 + lVar20 + 0x2c);
          auVar32 = vpermt2ps_avx512vl(auVar31,_DAT_01fbb150,
                                       ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)));
          fVar111 = *(float *)(pcVar4 + lVar20 + 0x30);
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),ZEXT416((uint)fVar52),
                                    ZEXT416((uint)fVar52));
          auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar111),ZEXT416((uint)fVar111));
          auVar37 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar30._0_4_));
          fVar116 = auVar37._0_4_;
          fVar116 = fVar116 * 1.5 + fVar116 * fVar116 * fVar116 * auVar30._0_4_ * -0.5;
          auVar30 = ZEXT416((uint)(fVar52 * fVar116));
          local_178 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar52 * fVar116)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar26 * fVar116));
          local_168 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar26 * fVar116)),0x30);
          auVar27 = ZEXT416((uint)(fVar111 * fVar116));
          local_138 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar111 * fVar116)),0x30);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),0x10);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x3c)),0x20);
          auStack_148 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar82 * fVar116)),0x30);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          local_168 = *(undefined1 (*) [16])(pcVar4 + lVar20);
          auStack_148 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x10);
          local_138 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x20);
          local_178 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x30);
        }
        pRVar3 = pRVar5 + (iVar21 + 1U);
        RVar1 = pRVar5[iVar21 + 1U].format;
        if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x10)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x20)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x14)),0x1c);
          auVar33 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),0x1c);
          auVar27 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x28)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x1c)),0x1c);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x2c)),0x28);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(pcVar4 + lVar20 + 4);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20)),_DAT_01fbb140,auVar35)
          ;
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),_DAT_01fbb140,
                                       auVar44);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          auVar27 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),_DAT_01fbb140,
                                       auVar36);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x28);
          auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),_DAT_01fbb140,
                                       auVar62);
        }
        else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          auVar34 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),0x20);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x34);
          auVar33 = vpermt2ps_avx512vl(auVar46,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar20)));
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          fVar52 = *(float *)(pcVar4 + lVar20 + 0x24);
          fVar26 = *(float *)(pcVar4 + lVar20 + 0x28);
          fVar82 = *(float *)(pcVar4 + lVar20 + 0x2c);
          auVar27 = vpermt2ps_avx512vl(auVar107,_DAT_01fbb150,
                                       ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)));
          fVar111 = *(float *)(pcVar4 + lVar20 + 0x30);
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),ZEXT416((uint)fVar52),
                                    ZEXT416((uint)fVar52));
          auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar111),ZEXT416((uint)fVar111));
          auVar132._4_12_ = ZEXT812(0) << 0x20;
          auVar132._0_4_ = auVar30._0_4_;
          auVar32 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar132);
          fVar116 = auVar32._0_4_;
          fVar116 = fVar116 * 1.5 + fVar116 * fVar116 * fVar116 * auVar30._0_4_ * -0.5;
          auVar30 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar52 * fVar116)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar33,ZEXT416((uint)(fVar26 * fVar116)),0x30);
          auVar27 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar111 * fVar116)),0x30);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),0x10);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x3c)),0x20);
          auVar33 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar82 * fVar116)),0x30);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar20))->v;
          auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x10);
          auVar27 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x20);
          auVar30 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x30);
        }
        auVar31 = vpermilps_avx(local_178,0xff);
        auVar35 = vpermilps_avx(local_168,0xff);
        auVar36 = vpermilps_avx(auStack_148,0xff);
        auVar62 = vpermilps_avx(local_138,0xff);
        auVar34 = vshufps_avx(auVar30,auVar30,0xff);
        auVar32 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
        auVar37 = vshufps_avx(auVar33,auVar33,0xff);
        auVar29 = vshufps_avx(auVar27,auVar27,0xff);
        fVar52 = auVar32._0_4_;
        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * auVar35._0_4_)),auVar34,auVar31);
        auVar44 = vfmadd231ss_fma(auVar44,auVar37,auVar36);
        auVar44 = vfmadd231ss_fma(auVar44,auVar29,auVar62);
        auVar68._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
        auVar68._8_4_ = auVar44._8_4_ ^ 0x80000000;
        auVar68._12_4_ = auVar44._12_4_ ^ 0x80000000;
        bVar17 = auVar44._0_4_ < -auVar44._0_4_;
        auVar38._4_12_ = auVar34._4_12_;
        auVar38._0_4_ = (uint)bVar17 * (auVar34._0_4_ ^ 0x80000000) + (uint)!bVar17 * auVar34._0_4_;
        auVar39._4_12_ = auVar32._4_12_;
        auVar39._0_4_ = (uint)bVar17 * (int)-fVar52 + (uint)!bVar17 * (int)fVar52;
        auVar40._4_12_ = auVar37._4_12_;
        auVar40._0_4_ = (uint)bVar17 * (auVar37._0_4_ ^ 0x80000000) + (uint)!bVar17 * auVar37._0_4_;
        auVar41._4_12_ = auVar29._4_12_;
        auVar41._0_4_ = (uint)bVar17 * (auVar29._0_4_ ^ 0x80000000) + (uint)!bVar17 * auVar29._0_4_;
        auVar16._8_4_ = 0x7fffffff;
        auVar16._0_8_ = 0x7fffffff7fffffff;
        auVar16._12_4_ = 0x7fffffff;
        auVar37 = vandps_avx512vl(auVar44,auVar16);
        auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar37,ZEXT416(0x3c9df1b8));
        auVar34 = vfmadd213ss_fma(auVar34,auVar37,ZEXT416(0xbd37e81c));
        auVar34 = vfmadd213ss_fma(auVar34,auVar37,ZEXT416(0x3db3edac));
        auVar34 = vfmadd213ss_fma(auVar34,auVar37,ZEXT416(0xbe5ba881));
        auVar32 = vfmadd213ss_fma(auVar34,auVar37,ZEXT416(0x3fc90fd1));
        auVar34 = vmaxss_avx(auVar68,auVar44);
        uVar51 = auVar34._0_4_;
        fVar52 = 1.0 - auVar37._0_4_;
        if (fVar52 < 0.0) {
          fVar52 = sqrtf(fVar52);
        }
        else {
          auVar34 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
          fVar52 = auVar34._0_4_;
        }
        auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar52 * auVar32._0_4_)))
        ;
        auVar29 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar32 = vxorps_avx512vl(auVar34,auVar29);
        uVar7 = vcmpss_avx512f(ZEXT416(uVar51),ZEXT816(0) << 0x40,1);
        bVar17 = (bool)((byte)uVar7 & 1);
        uVar7 = vcmpss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)auVar37._0_4_),1);
        bVar9 = (bool)((byte)uVar7 & 1);
        fVar52 = fVar91 * (float)((uint)bVar9 * 0x7fc00000 +
                                 (uint)!bVar9 *
                                 (int)(1.5707964 -
                                      (float)((uint)bVar17 * auVar32._0_4_ +
                                             (uint)!bVar17 * auVar34._0_4_)));
        auVar34 = ZEXT416((uint)(fVar52 * 0.63661975));
        auVar34 = vroundss_avx(auVar34,auVar34,9);
        auVar32 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar34,ZEXT416((uint)fVar52));
        uVar22 = (int)auVar34._0_4_ & 3;
        uVar23 = uVar22 - 1;
        fVar26 = auVar32._0_4_;
        fVar52 = fVar26 * fVar26;
        auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar52),
                                  ZEXT416(0x363938a8));
        auVar37 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar52),
                                  ZEXT416(0x37cfab9c));
        auVar44 = ZEXT416((uint)fVar52);
        auVar32 = vfmadd213ss_fma(auVar32,auVar44,ZEXT416(0xb9501096));
        auVar37 = vfmadd213ss_fma(auVar37,auVar44,ZEXT416(0xbab60981));
        auVar32 = vfmadd213ss_fma(auVar32,auVar44,ZEXT416(0x3c088898));
        auVar37 = vfmadd213ss_fma(auVar37,auVar44,ZEXT416(0x3d2aaaa4));
        auVar44 = ZEXT416((uint)fVar52);
        auVar32 = vfmadd213ss_fma(auVar32,auVar44,ZEXT416(0xbe2aaaab));
        auVar37 = vfmadd213ss_fma(auVar37,auVar44,SUB6416(ZEXT464(0xbf000000),0));
        auVar32 = vfmadd213ss_avx512f(auVar32,auVar44,ZEXT416(0x3f800000));
        auVar37 = vfmadd213ss_avx512f(auVar37,auVar44,ZEXT416(0x3f800000));
        fVar26 = fVar26 * auVar32._0_4_;
        bVar8 = (byte)(int)auVar34._0_4_;
        uVar25 = (uint)(bVar8 & 1) * auVar37._0_4_ + (uint)!(bool)(bVar8 & 1) * (int)fVar26;
        auVar42._4_12_ = auVar37._4_12_;
        auVar42._0_4_ = (uint)(bVar8 & 1) * (int)fVar26 + (uint)!(bool)(bVar8 & 1) * auVar37._0_4_;
        auVar34 = vxorps_avx512vl(auVar42,auVar29);
        auVar43._0_4_ = (uint)(uVar23 < 2) * auVar34._0_4_ + (uint)(uVar23 >= 2) * auVar42._0_4_;
        auVar43._4_12_ = auVar42._4_12_;
        auVar32 = vfmsub213ss_avx512f(auVar31,ZEXT416(uVar51),auVar38);
        auVar44 = ZEXT416(uVar51);
        auVar34 = vfmsub213ss_avx512f(auVar35,auVar44,auVar39);
        auVar37 = vfmsub213ss_avx512f(auVar36,auVar44,auVar40);
        auVar44 = vfmsub213ss_avx512f(auVar62,auVar44,auVar41);
        fVar82 = auVar34._0_4_;
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * fVar82)),auVar32,auVar32);
        auVar34 = vfmadd231ss_fma(auVar34,auVar37,auVar37);
        auVar34 = vfmadd231ss_fma(auVar34,auVar44,auVar44);
        auVar63._12_4_ = 0;
        auVar63._0_12_ = ZEXT812(0);
        auVar63 = auVar63 << 0x20;
        auVar45 = vrsqrt14ss_avx512f(auVar63,ZEXT416((uint)auVar34._0_4_));
        fVar52 = auVar45._0_4_;
        fVar52 = fVar52 * 1.5 + fVar52 * fVar52 * fVar52 * auVar34._0_4_ * -0.5;
        auVar34 = vxorps_avx512vl(ZEXT416(uVar25),auVar29);
        fVar26 = (float)((1 < uVar22) * uVar25 + (uint)(1 >= uVar22) * auVar34._0_4_);
        auVar45 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar26 * fVar52 * auVar32._0_4_)),auVar43,
                                      auVar31);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar52 * fVar82)),auVar43,auVar35);
        auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * auVar37._0_4_ * fVar26)),auVar43,auVar36);
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar52 * auVar44._0_4_)),auVar62,auVar43);
        auVar44 = vsubss_avx512f(ZEXT416(0x3f800000),auVar28);
        auVar29 = vmulss_avx512f(auVar28,auVar38);
        auVar46 = vfmadd231ss_avx512f(auVar29,auVar44,auVar31);
        auVar29 = vmulss_avx512f(auVar28,auVar39);
        auVar29 = vfmadd231ss_fma(auVar29,auVar44,auVar35);
        auVar31 = vmulss_avx512f(auVar28,auVar40);
        auVar31 = vfmadd231ss_fma(auVar31,auVar44,auVar36);
        auVar28 = vmulss_avx512f(auVar28,auVar41);
        auVar28 = vfmadd231ss_fma(auVar28,auVar44,auVar62);
        fVar26 = auVar29._0_4_;
        auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),auVar46,auVar46);
        auVar29 = vfmadd231ss_fma(auVar29,auVar31,auVar31);
        auVar29 = vfmadd231ss_fma(auVar29,auVar28,auVar28);
        auVar35 = vrsqrt14ss_avx512f(auVar63,ZEXT416((uint)auVar29._0_4_));
        fVar52 = auVar35._0_4_;
        fVar52 = fVar52 * 1.5 + fVar52 * fVar52 * fVar52 * auVar29._0_4_ * -0.5;
        vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
        bVar17 = 2 < uVar23;
        auVar47._4_12_ = auVar45._4_12_;
        auVar47._0_4_ =
             (float)((uint)bVar17 * (int)(auVar46._0_4_ * fVar52) + (uint)!bVar17 * auVar45._0_4_);
        auVar48._4_12_ = auVar34._4_12_;
        auVar48._0_4_ =
             (float)((uint)bVar17 * (int)(fVar26 * fVar52) + (uint)!bVar17 * auVar34._0_4_);
        auVar49._4_12_ = auVar32._4_12_;
        auVar49._0_4_ =
             (float)((uint)bVar17 * (int)(auVar31._0_4_ * fVar52) + (uint)!bVar17 * auVar32._0_4_);
        auVar50._4_12_ = auVar37._4_12_;
        auVar50._0_4_ =
             (float)((uint)bVar17 * (int)(auVar28._0_4_ * fVar52) + (uint)!bVar17 * auVar37._0_4_);
        local_68 = b0.field_0._0_4_;
        fStack_64 = b0.field_0._4_4_;
        fStack_60 = b0.field_0._8_4_;
        fStack_5c = b0.field_0._12_4_;
        auVar120._0_4_ = fVar91 * local_68;
        auVar120._4_4_ = fVar91 * fStack_64;
        auVar120._8_4_ = fVar91 * fStack_60;
        auVar120._12_4_ = fVar91 * fStack_5c;
        auVar115._0_4_ = auVar44._0_4_;
        auVar115._4_4_ = auVar115._0_4_;
        auVar115._8_4_ = auVar115._0_4_;
        auVar115._12_4_ = auVar115._0_4_;
        auVar29 = vfmadd213ps_avx512vl(local_168,auVar115,auVar120);
        local_78 = auVar33._0_4_;
        fStack_74 = auVar33._4_4_;
        fStack_70 = auVar33._8_4_;
        fStack_6c = auVar33._12_4_;
        auVar121._0_4_ = fVar91 * local_78;
        auVar121._4_4_ = fVar91 * fStack_74;
        auVar121._8_4_ = fVar91 * fStack_70;
        auVar121._12_4_ = fVar91 * fStack_6c;
        auVar28 = vfmadd213ps_fma(auStack_148,auVar115,auVar121);
        local_88 = auVar27._0_4_;
        fStack_84 = auVar27._4_4_;
        fStack_80 = auVar27._8_4_;
        fStack_7c = auVar27._12_4_;
        auVar122._0_4_ = fVar91 * local_88;
        auVar122._4_4_ = fVar91 * fStack_84;
        auVar122._8_4_ = fVar91 * fStack_80;
        auVar122._12_4_ = fVar91 * fStack_7c;
        auVar31 = vfmadd213ps_avx512vl(local_138,auVar115,auVar122);
        local_98 = auVar30._0_4_;
        fStack_94 = auVar30._4_4_;
        fStack_90 = auVar30._8_4_;
        fStack_8c = auVar30._12_4_;
        auVar108._0_4_ = fVar91 * local_98;
        auVar108._4_4_ = fVar91 * fStack_94;
        auVar108._8_4_ = fVar91 * fStack_90;
        auVar108._12_4_ = fVar91 * fStack_8c;
        auVar34 = vfmadd213ps_fma(local_178,auVar115,auVar108);
        auVar30 = vshufps_avx512vl(auVar29,auVar63,0xe9);
        auVar30 = vblendps_avx(auVar30,auVar28,4);
        auVar33 = vfmadd213ss_fma(auVar47,auVar47,ZEXT416((uint)(auVar48._0_4_ * auVar48._0_4_)));
        auVar33 = vfnmadd231ss_fma(auVar33,auVar49,auVar49);
        auVar32 = vfnmadd231ss_fma(auVar33,auVar50,auVar50);
        auVar33 = vfmadd213ss_fma(auVar49,auVar48,ZEXT416((uint)(auVar47._0_4_ * auVar50._0_4_)));
        fVar52 = auVar33._0_4_ + auVar33._0_4_;
        auVar33 = vfmsub213ss_fma(auVar50,auVar48,ZEXT416((uint)(auVar47._0_4_ * auVar49._0_4_)));
        fVar91 = auVar33._0_4_ + auVar33._0_4_;
        auVar33 = vfmsub231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar50._0_4_)),auVar48,auVar49);
        fVar26 = auVar33._0_4_ + auVar33._0_4_;
        auVar27 = vfmsub231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar48._0_4_)),auVar47,auVar47);
        auVar33 = vfmadd213ss_fma(auVar49,auVar49,auVar27);
        auVar37 = vfnmadd231ss_fma(auVar33,auVar50,auVar50);
        auVar33 = vfmadd213ss_fma(auVar50,auVar49,ZEXT416((uint)(auVar47._0_4_ * auVar48._0_4_)));
        fVar82 = auVar33._0_4_ + auVar33._0_4_;
        auVar33 = vfmadd213ss_fma(auVar48,auVar50,ZEXT416((uint)(auVar47._0_4_ * auVar49._0_4_)));
        fVar111 = auVar33._0_4_ + auVar33._0_4_;
        auVar33 = vfmsub231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar48._0_4_)),auVar49,auVar50);
        fVar116 = auVar33._0_4_ + auVar33._0_4_;
        auVar33 = vfnmadd231ss_fma(auVar27,auVar49,auVar49);
        auVar27 = vfmadd231ss_fma(auVar33,auVar50,auVar50);
        uVar81 = auVar32._0_4_;
        auVar69._4_4_ = uVar81;
        auVar69._0_4_ = uVar81;
        auVar69._8_4_ = uVar81;
        auVar69._12_4_ = uVar81;
        auVar76._4_4_ = fVar52;
        auVar76._0_4_ = fVar52;
        auVar76._8_4_ = fVar52;
        auVar76._12_4_ = fVar52;
        auVar131._0_4_ = fVar91 * 0.0;
        auVar131._4_4_ = fVar91 * 0.0;
        auVar131._8_4_ = fVar91 * 1.0;
        auVar131._12_4_ = fVar91 * 0.0;
        auVar35 = ZEXT816(0x3f80000000000000);
        auVar33 = vfmadd231ps_fma(auVar131,auVar35,auVar76);
        auVar36 = SUB6416(ZEXT464(0x3f800000),0);
        auVar32 = vfmadd231ps_fma(auVar33,auVar36,auVar69);
        auVar70._4_4_ = fVar26;
        auVar70._0_4_ = fVar26;
        auVar70._8_4_ = fVar26;
        auVar70._12_4_ = fVar26;
        uVar81 = auVar37._0_4_;
        auVar77._4_4_ = uVar81;
        auVar77._0_4_ = uVar81;
        auVar77._8_4_ = uVar81;
        auVar77._12_4_ = uVar81;
        auVar127._0_4_ = fVar82 * 0.0;
        auVar127._4_4_ = fVar82 * 0.0;
        auVar127._8_4_ = fVar82 * 1.0;
        auVar127._12_4_ = fVar82 * 0.0;
        auVar33 = vfmadd231ps_fma(auVar127,auVar35,auVar77);
        auVar37 = vfmadd231ps_fma(auVar33,auVar36,auVar70);
        auVar71._4_4_ = fVar111;
        auVar71._0_4_ = fVar111;
        auVar71._8_4_ = fVar111;
        auVar71._12_4_ = fVar111;
        auVar78._4_4_ = fVar116;
        auVar78._0_4_ = fVar116;
        auVar78._8_4_ = fVar116;
        auVar78._12_4_ = fVar116;
        fVar52 = auVar27._0_4_;
        auVar89._0_4_ = fVar52 * 0.0;
        auVar89._4_4_ = fVar52 * 0.0;
        auVar89._8_4_ = fVar52 * 1.0;
        auVar89._12_4_ = fVar52 * 0.0;
        auVar33 = vfmadd231ps_fma(auVar89,auVar35,auVar78);
        auVar33 = vfmadd231ps_fma(auVar33,auVar36,auVar71);
        auVar27 = vbroadcastss_avx512vl(auVar29);
        fVar52 = auVar33._0_4_;
        auVar79._0_4_ = fVar52 * 0.0;
        fVar91 = auVar33._4_4_;
        auVar79._4_4_ = fVar91 * 0.0;
        fVar26 = auVar33._8_4_;
        auVar79._8_4_ = fVar26 * 0.0;
        fVar82 = auVar33._12_4_;
        auVar79._12_4_ = fVar82 * 0.0;
        auVar33 = vfmadd213ps_fma(auVar63,auVar37,auVar79);
        auVar27 = vfmadd231ps_fma(auVar33,auVar32,auVar27);
        uVar81 = auVar28._0_4_;
        auVar109._4_4_ = uVar81;
        auVar109._0_4_ = uVar81;
        auVar109._8_4_ = uVar81;
        auVar109._12_4_ = uVar81;
        auVar28 = vshufps_avx(auVar28,auVar28,0x55);
        auVar28 = vfmadd213ps_fma(auVar28,auVar37,auVar79);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar28,auVar32,auVar109);
        auVar33 = vbroadcastss_avx512vl(auVar31);
        auVar28 = vshufps_avx512vl(auVar31,auVar31,0x55);
        auVar29 = vshufps_avx512vl(auVar31,auVar31,0xaa);
        auVar80._0_4_ = auVar29._0_4_ * fVar52;
        auVar80._4_4_ = auVar29._4_4_ * fVar91;
        auVar80._8_4_ = auVar29._8_4_ * fVar26;
        auVar80._12_4_ = auVar29._12_4_ * fVar82;
        auVar28 = vfmadd231ps_fma(auVar80,auVar37,auVar28);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar28,auVar32,auVar33);
        uVar81 = auVar34._0_4_;
        auVar110._4_4_ = uVar81;
        auVar110._0_4_ = uVar81;
        auVar110._8_4_ = uVar81;
        auVar110._12_4_ = uVar81;
        auVar28 = vshufps_avx(auVar34,auVar34,0x55);
        auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
        auVar90._0_4_ = auVar34._0_4_ * fVar52;
        auVar90._4_4_ = auVar34._4_4_ * fVar91;
        auVar90._8_4_ = auVar34._8_4_ * fVar26;
        auVar90._12_4_ = auVar34._12_4_ * fVar82;
        auVar28 = vfmadd231ps_fma(auVar90,auVar37,auVar28);
        auVar34 = vfmadd231ps_fma(auVar28,auVar32,auVar110);
        auVar28._0_4_ = auVar30._0_4_ + 0.0 + auVar34._0_4_;
        auVar28._4_4_ = auVar30._4_4_ + 0.0 + auVar34._4_4_;
        auVar28._8_4_ = auVar30._8_4_ + 0.0 + auVar34._8_4_;
        auVar28._12_4_ = auVar30._12_4_ + 0.0 + auVar34._12_4_;
      }
      else {
        if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x10)),0x1c);
          auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x20)),0x28);
          auVar27 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x14)),0x1c);
          auVar32 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),0x28);
          auVar27 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),0x1c);
          auVar37 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x28)),0x28);
          auVar27 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x1c)),0x1c);
          auVar29 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x2c)),0x28);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(pcVar4 + lVar20 + 4);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          auVar28 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20)),_DAT_01fbb140,auVar73);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),_DAT_01fbb140,
                                       auVar85);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          auVar37 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),_DAT_01fbb140,
                                       auVar86);
          b0.field_0._8_8_ = 0;
          b0.field_0._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x28);
          auVar29 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),_DAT_01fbb140,
                                       (undefined1  [16])b0.field_0);
          auVar33 = _DAT_01fbb140;
        }
        else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          auVar33 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),0x20);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x34);
          auVar27 = vpermt2ps_avx512vl(auVar56,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar20)));
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          fVar52 = *(float *)(pcVar4 + lVar20 + 0x24);
          auVar30 = ZEXT416((uint)fVar52);
          fVar26 = *(float *)(pcVar4 + lVar20 + 0x28);
          auVar34 = ZEXT416((uint)fVar26);
          fVar82 = *(float *)(pcVar4 + lVar20 + 0x2c);
          auVar32 = vpermt2ps_avx512vl(auVar103,_DAT_01fbb150,
                                       ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)));
          fVar111 = *(float *)(pcVar4 + lVar20 + 0x30);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),ZEXT416((uint)fVar52),
                                    ZEXT416((uint)fVar52));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar111),ZEXT416((uint)fVar111));
          auVar37 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar28._0_4_));
          fVar116 = auVar37._0_4_;
          fVar116 = fVar116 * 1.5 + fVar116 * fVar116 * fVar116 * auVar28._0_4_ * -0.5;
          auVar29 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar116 * fVar52)),0x30);
          auVar28 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar116 * fVar26)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar82 * fVar116));
          auVar37 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar116 * fVar111)),0x30);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),0x10);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x3c)),0x20);
          auVar32 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar82 * fVar116)),0x30);
          auVar33 = ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc));
        }
        else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = pRVar3->stride * uVar19;
          auVar28 = *(undefined1 (*) [16])(pcVar4 + lVar20);
          auVar32 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x10);
          auVar37 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x20);
          auVar29 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x30);
        }
        pRVar3 = pRVar5 + (iVar21 + 1U);
        RVar1 = pRVar5[iVar21 + 1U].format;
        if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x10)),0x1c);
          auVar33 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x20)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x14)),0x1c);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),0x1c);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x28)),0x28);
          auVar27 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x1c)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar27,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x2c)),0x28);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = *(ulong *)(pcVar4 + lVar20 + 4);
          auVar117._8_8_ = 0;
          auVar117._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20)),_DAT_01fbb140,auVar104);
          auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),_DAT_01fbb140,
                                       auVar117);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)),_DAT_01fbb140,
                                       auVar105);
          auVar128._8_8_ = 0;
          auVar128._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x28);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x24)),_DAT_01fbb140,
                                          auVar128);
        }
        else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar92._8_8_ = 0;
          auVar92._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x10);
          auVar30 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(pcVar4 + lVar20 + 8)),0x20);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x34);
          auVar33 = vpermt2ps_avx512vl(auVar93,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar20)));
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)(pcVar4 + lVar20 + 0x1c);
          fVar52 = *(float *)(pcVar4 + lVar20 + 0x24);
          fVar26 = *(float *)(pcVar4 + lVar20 + 0x28);
          fVar82 = *(float *)(pcVar4 + lVar20 + 0x2c);
          auVar27 = vpermt2ps_avx512vl(auVar129,_DAT_01fbb150,
                                       ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x18)));
          fVar111 = *(float *)(pcVar4 + lVar20 + 0x30);
          auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),ZEXT416((uint)fVar52),
                                    ZEXT416((uint)fVar52));
          auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar111),ZEXT416((uint)fVar111));
          auVar135._4_12_ = ZEXT812(0) << 0x20;
          auVar135._0_4_ = auVar34._0_4_;
          auVar31 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar135);
          fVar116 = auVar31._0_4_;
          fVar116 = fVar116 * 1.5 + fVar116 * fVar116 * fVar116 * auVar34._0_4_ * -0.5;
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar27,ZEXT416((uint)(fVar52 * fVar116)),0x30);
          auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar26 * fVar116)),0x30);
          auVar34 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar116 * fVar111)),0x30);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar4 + lVar20 + 4)),0x10);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar4 + lVar20 + 0x3c)),0x20);
          auVar30 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar82 * fVar116)),0x30);
        }
        else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar4 = pRVar3->ptr_ofs;
          lVar20 = uVar19 * pRVar3->stride;
          auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar20);
          auVar30 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x10);
          auVar34 = *(undefined1 (*) [16])(pcVar4 + lVar20 + 0x20);
          b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar20 + 0x30))
                        ->v;
        }
        fVar52 = 1.0 - fVar91;
        auVar94._0_4_ = fVar91 * auVar33._0_4_;
        auVar94._4_4_ = fVar91 * auVar33._4_4_;
        auVar94._8_4_ = fVar91 * auVar33._8_4_;
        auVar94._12_4_ = fVar91 * auVar33._12_4_;
        auVar123._4_4_ = fVar52;
        auVar123._0_4_ = fVar52;
        auVar123._8_4_ = fVar52;
        auVar123._12_4_ = fVar52;
        auVar27 = vfmadd213ps_fma(auVar28,auVar123,auVar94);
        auVar95._0_4_ = fVar91 * auVar30._0_4_;
        auVar95._4_4_ = fVar91 * auVar30._4_4_;
        auVar95._8_4_ = fVar91 * auVar30._8_4_;
        auVar95._12_4_ = fVar91 * auVar30._12_4_;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar32,auVar123,auVar95);
        auVar96._0_4_ = fVar91 * auVar34._0_4_;
        auVar96._4_4_ = fVar91 * auVar34._4_4_;
        auVar96._8_4_ = fVar91 * auVar34._8_4_;
        auVar96._12_4_ = fVar91 * auVar34._12_4_;
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd213ps_fma(auVar37,auVar123,auVar96);
        auVar97._0_4_ = fVar91 * b0.field_0._0_4_;
        auVar97._4_4_ = fVar91 * b0.field_0._4_4_;
        auVar97._8_4_ = fVar91 * b0.field_0._8_4_;
        auVar97._12_4_ = fVar91 * b0.field_0._12_4_;
        auVar28 = vfmadd213ps_fma(auVar29,auVar123,auVar97);
      }
    }
    auVar30 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar34 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar112._0_4_ = a0_1.field_0._0_4_ * auVar34._0_4_;
    auVar112._4_4_ = a0_1.field_0._4_4_ * auVar34._4_4_;
    auVar112._8_4_ = a0_1.field_0._8_4_ * auVar34._8_4_;
    auVar112._12_4_ = a0_1.field_0._12_4_ * auVar34._12_4_;
    auVar37 = vfmsub231ps_fma(auVar112,(undefined1  [16])a0.field_0,auVar30);
    auVar33 = vshufps_avx(auVar37,auVar37,0xc9);
    auVar32 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar98._0_4_ = auVar27._0_4_ * auVar30._0_4_;
    auVar98._4_4_ = auVar27._4_4_ * auVar30._4_4_;
    auVar98._8_4_ = auVar27._8_4_ * auVar30._8_4_;
    auVar98._12_4_ = auVar27._12_4_ * auVar30._12_4_;
    auVar29 = vfmsub231ps_fma(auVar98,auVar32,(undefined1  [16])a0_1.field_0);
    auVar64._0_4_ = auVar32._0_4_ * a0.field_0._0_4_;
    auVar64._4_4_ = auVar32._4_4_ * a0.field_0._4_4_;
    auVar64._8_4_ = auVar32._8_4_ * a0.field_0._8_4_;
    auVar64._12_4_ = auVar32._12_4_ * a0.field_0._12_4_;
    auVar34 = vfmsub231ps_fma(auVar64,auVar27,auVar34);
    auVar30 = vshufps_avx(auVar34,auVar34,0xc9);
    auVar32 = vunpcklps_avx(auVar33,auVar30);
    auVar30 = vunpcklps_avx(auVar37,auVar34);
    auVar34 = vinsertps_avx(auVar29,auVar29,0x4a);
    auVar37 = vunpcklps_avx(auVar30,ZEXT416(auVar29._0_4_));
    auVar30 = vdpps_avx(auVar27,auVar33,0x7f);
    auVar27 = vunpcklps_avx(auVar32,auVar34);
    auVar33 = vunpckhps_avx(auVar32,auVar34);
    auVar57._0_4_ = auVar30._0_4_;
    auVar57._4_4_ = auVar57._0_4_;
    auVar57._8_4_ = auVar57._0_4_;
    auVar57._12_4_ = auVar57._0_4_;
    auVar34 = vdivps_avx(auVar27,auVar57);
    auVar33 = vdivps_avx(auVar33,auVar57);
    auVar27 = vdivps_avx(auVar37,auVar57);
    uVar81 = auVar28._0_4_;
    auVar65._4_4_ = uVar81;
    auVar65._0_4_ = uVar81;
    auVar65._8_4_ = uVar81;
    auVar65._12_4_ = uVar81;
    auVar30 = vshufps_avx(auVar28,auVar28,0x55);
    auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
    auVar87._0_4_ = auVar28._0_4_ * auVar27._0_4_;
    auVar87._4_4_ = auVar28._4_4_ * auVar27._4_4_;
    auVar87._8_4_ = auVar28._8_4_ * auVar27._8_4_;
    auVar87._12_4_ = auVar28._12_4_ * auVar27._12_4_;
    auVar28 = vfmadd231ps_fma(auVar87,auVar33,auVar30);
    auVar32 = vfmadd231ps_fma(auVar28,auVar34,auVar65);
    auVar28 = *(undefined1 (*) [16])(ray->org).field_0.m128;
    auVar30 = *(undefined1 (*) [16])(ray->dir).field_0.m128;
    uVar81 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar10._4_4_ = uVar81;
    auVar10._0_4_ = uVar81;
    auVar10._8_4_ = uVar81;
    auVar10._12_4_ = uVar81;
    auVar32 = vfmsub231ps_avx512vl(auVar32,auVar27,auVar10);
    uVar81 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar11._4_4_ = uVar81;
    auVar11._0_4_ = uVar81;
    auVar11._8_4_ = uVar81;
    auVar11._12_4_ = uVar81;
    auVar32 = vfmadd231ps_avx512vl(auVar32,auVar33,auVar11);
    uVar81 = *(undefined4 *)&(ray->org).field_0;
    auVar12._4_4_ = uVar81;
    auVar12._0_4_ = uVar81;
    auVar12._8_4_ = uVar81;
    auVar12._12_4_ = uVar81;
    auVar32 = vfmadd231ps_avx512vl(auVar32,auVar34,auVar12);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar32,auVar28,8);
    (ray->org).field_0 = aVar6;
    uVar81 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
    auVar13._4_4_ = uVar81;
    auVar13._0_4_ = uVar81;
    auVar13._8_4_ = uVar81;
    auVar13._12_4_ = uVar81;
    auVar27 = vmulps_avx512vl(auVar27,auVar13);
    uVar81 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
    auVar14._4_4_ = uVar81;
    auVar14._0_4_ = uVar81;
    auVar14._8_4_ = uVar81;
    auVar14._12_4_ = uVar81;
    auVar33 = vfmadd231ps_avx512vl(auVar27,auVar33,auVar14);
    uVar81 = *(undefined4 *)&(ray->dir).field_0;
    auVar15._4_4_ = uVar81;
    auVar15._0_4_ = uVar81;
    auVar15._8_4_ = uVar81;
    auVar15._12_4_ = uVar81;
    auVar34 = vfmadd231ps_avx512vl(auVar33,auVar34,auVar15);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar34,auVar30,8);
    (ray->dir).field_0 = aVar6;
    (**(code **)&pAVar18->field_0x80)(&(pAVar18->super_AccelData).field_0x58,ray);
    local_168._0_8_ = auVar28._0_8_;
    local_168._8_8_ = auVar28._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_168._0_8_;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = local_168._8_8_;
    local_178._0_8_ = auVar30._0_8_;
    local_178._8_8_ = auVar30._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_178._0_8_;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = local_178._8_8_;
    bVar17 = ray->tfar < 0.0;
    pRVar2->instID[0] = 0xffffffff;
    pRVar2->instPrimID[0] = 0xffffffff;
  }
  return bVar17;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }